

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O3

PSocket * p_socket_accept(PSocket *socket,PError **error)

{
  pboolean pVar1;
  int __fd;
  pint pVar2;
  pint pVar3;
  PErrorIO code;
  uint uVar4;
  int iVar5;
  PSocket *pPVar6;
  byte bVar7;
  
  if (socket == (PSocket *)0x0) {
    p_socket_accept_cold_2();
  }
  else {
    bVar7 = socket->field_0x18;
    if ((bVar7 & 4) == 0) {
      do {
        while( true ) {
          if (((bVar7 & 1) != 0) &&
             (pVar1 = p_socket_io_condition_wait(socket,P_SOCKET_IO_CONDITION_POLLIN,error),
             pVar1 == 0)) {
            return (PSocket *)0x0;
          }
          __fd = accept(socket->fd,(sockaddr *)0x0,(socklen_t *)0x0);
          if (-1 < __fd) {
            uVar4 = fcntl(__fd,1,0);
            if (((uVar4 & 1) == 0) && (iVar5 = fcntl(__fd,2,(ulong)(uVar4 | 1)), iVar5 < 0)) {
              printf("** Warning: %s **\n",
                     "PSocket::p_socket_accept: fcntl() with FD_CLOEXEC failed");
            }
            pPVar6 = p_socket_new_from_fd(__fd,error);
            if (pPVar6 == (PSocket *)0x0) {
              pVar2 = p_sys_close(__fd);
              if (pVar2 == 0) {
                return (PSocket *)0x0;
              }
              printf("** Warning: %s **\n","PSocket::p_socket_accept: p_sys_close() failed");
              return (PSocket *)0x0;
            }
            pPVar6->protocol = socket->protocol;
            return pPVar6;
          }
          pVar2 = p_error_get_last_net();
          pVar3 = p_error_get_last_net();
          if (pVar3 != 4) break;
          bVar7 = socket->field_0x18;
        }
        code = p_error_get_io_from_system(pVar2);
        bVar7 = socket->field_0x18;
      } while (((bVar7 & 1) != 0) && (code == P_ERROR_IO_WOULD_BLOCK));
      p_error_set_error_p(error,code,pVar2,"Failed to call accept() on socket");
    }
    else {
      p_socket_accept_cold_1();
    }
  }
  return (PSocket *)0x0;
}

Assistant:

P_LIB_API PSocket *
p_socket_accept (const PSocket	*socket,
		 PError		**error)
{
	PSocket		*ret;
	PErrorIO	sock_err;
	pint		res;
	pint		err_code;
#ifndef P_OS_WIN
	pint		flags;
#endif

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return NULL;

	for (;;) {
		if (socket->blocking &&
		    p_socket_io_condition_wait (socket,
						P_SOCKET_IO_CONDITION_POLLIN,
						error) == FALSE)
			return NULL;

		if ((res = (pint) accept (socket->fd, NULL, 0)) < 0) {
			err_code = p_error_get_last_net ();
#if !defined (P_OS_WIN) && defined (EINTR)
			if (p_error_get_last_net () == EINTR)
				continue;
#endif
			sock_err = p_error_get_io_from_system (err_code);

			if (socket->blocking && sock_err == P_ERROR_IO_WOULD_BLOCK)
				continue;

			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Failed to call accept() on socket");

			return NULL;
		}

		break;
	}

#ifdef P_OS_WIN
	/* The socket inherits the accepting sockets event mask and even object,
	 * we need to remove that */
	WSAEventSelect (res, NULL, 0);
#else
	flags = fcntl (res, F_GETFD, 0);

	if (P_LIKELY (flags != -1 && (flags & FD_CLOEXEC) == 0)) {
		flags |= FD_CLOEXEC;

		if (P_UNLIKELY (fcntl (res, F_SETFD, flags) < 0))
			P_WARNING ("PSocket::p_socket_accept: fcntl() with FD_CLOEXEC failed");
	}
#endif

	if (P_UNLIKELY ((ret = p_socket_new_from_fd (res, error)) == NULL)) {
		if (P_UNLIKELY (p_sys_close (res) != 0))
			P_WARNING ("PSocket::p_socket_accept: p_sys_close() failed");
	} else
		ret->protocol = socket->protocol;

	return ret;
}